

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntryNode.cpp
# Opt level: O0

bool __thiscall EntryNode::removeForkPredecessor(EntryNode *this,ForkNode *forkNode)

{
  size_type sVar1;
  long in_RSI;
  set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_> *in_RDI;
  set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> *in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    std::set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>::erase
              (in_stack_ffffffffffffffe0,(key_type *)in_RDI);
    sVar1 = std::set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_>::erase
                      (in_RDI,(key_type *)in_RDI);
    local_1 = sVar1 != 0;
  }
  return local_1;
}

Assistant:

bool EntryNode::removeForkPredecessor(ForkNode *forkNode) {
    if (!forkNode) {
        return false;
    }
    forkPredecessors_.erase(forkNode);
    return forkNode->forkSuccessors_.erase(this);
}